

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  ulong uVar32;
  ulong uVar33;
  byte bVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar46;
  StackItemT<embree::NodeRefPtr<4>_> SVar47;
  StackItemT<embree::NodeRefPtr<4>_> SVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined4 uVar85;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [16];
  float fVar90;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 local_11c8 [16];
  long local_11b8;
  long local_11b0;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  float local_1068 [4];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar26;
  
  pSVar31 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar96 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar84 * 0.99999964)));
  auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar90 * 0.99999964)));
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar96 * 0.99999964)));
  fVar84 = fVar84 * 1.0000004;
  fVar90 = fVar90 * 1.0000004;
  fVar96 = fVar96 * 1.0000004;
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar1 = (tray->tnear).field_0.i[k];
  local_1048._4_4_ = iVar1;
  local_1048._0_4_ = iVar1;
  local_1048._8_4_ = iVar1;
  local_1048._12_4_ = iVar1;
  auVar103 = ZEXT1664(local_1048);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar75 = ZEXT1664(CONCAT412(iVar1,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))));
  local_1058 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_1018 = fVar84;
  fStack_1014 = fVar84;
  fStack_1010 = fVar84;
  fStack_100c = fVar84;
  local_1028 = fVar90;
  fStack_1024 = fVar90;
  fStack_1020 = fVar90;
  fStack_101c = fVar90;
  local_1038 = fVar96;
  fStack_1034 = fVar96;
  fStack_1030 = fVar96;
  fStack_102c = fVar96;
  fVar87 = fVar84;
  fVar88 = fVar84;
  fVar89 = fVar84;
  fVar93 = fVar90;
  fVar94 = fVar90;
  fVar95 = fVar90;
  fVar97 = fVar96;
  fVar98 = fVar96;
  fVar99 = fVar96;
LAB_01cbf921:
  do {
    do {
      if (pSVar31 == stack) {
        return;
      }
      pSVar21 = pSVar31 + -1;
      pSVar31 = pSVar31 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar21->dist);
    uVar35 = (pSVar31->ptr).ptr;
    while ((uVar35 & 8) == 0) {
      uVar22 = uVar35 & 0xfffffffffffffff0;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar45._4_4_ = uVar85;
      auVar45._0_4_ = uVar85;
      auVar45._8_4_ = uVar85;
      auVar45._12_4_ = uVar85;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + uVar30),auVar45,
                                *(undefined1 (*) [16])(uVar22 + 0x20 + uVar30));
      auVar42 = vsubps_avx512vl(auVar42,auVar36);
      auVar42 = vmulps_avx512vl(auVar39,auVar42);
      auVar42 = vmaxps_avx(auVar103._0_16_,auVar42);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + uVar33),auVar45,
                                *(undefined1 (*) [16])(uVar22 + 0x20 + uVar33));
      auVar43 = vsubps_avx512vl(auVar43,auVar37);
      auVar44 = vmulps_avx512vl(auVar40,auVar43);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + uVar32),auVar45,
                                *(undefined1 (*) [16])(uVar22 + 0x20 + uVar32));
      auVar43 = vsubps_avx512vl(auVar43,auVar38);
      auVar43 = vmulps_avx512vl(auVar41,auVar43);
      auVar43 = vmaxps_avx(auVar44,auVar43);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar42,auVar43);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + (uVar30 ^ 0x10)),auVar45,
                                *(undefined1 (*) [16])(uVar22 + 0x20 + (uVar30 ^ 0x10)));
      auVar42 = vsubps_avx512vl(auVar42,auVar36);
      auVar43._0_4_ = fVar84 * auVar42._0_4_;
      auVar43._4_4_ = fVar87 * auVar42._4_4_;
      auVar43._8_4_ = fVar88 * auVar42._8_4_;
      auVar43._12_4_ = fVar89 * auVar42._12_4_;
      auVar42 = vminps_avx(auVar75._0_16_,auVar43);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + (uVar33 ^ 0x10)),auVar45,
                                *(undefined1 (*) [16])(uVar22 + 0x20 + (uVar33 ^ 0x10)));
      auVar43 = vsubps_avx512vl(auVar43,auVar37);
      auVar44._0_4_ = fVar90 * auVar43._0_4_;
      auVar44._4_4_ = fVar93 * auVar43._4_4_;
      auVar44._8_4_ = fVar94 * auVar43._8_4_;
      auVar44._12_4_ = fVar95 * auVar43._12_4_;
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + (uVar32 ^ 0x10)),auVar45,
                                *(undefined1 (*) [16])(uVar22 + 0x20 + (uVar32 ^ 0x10)));
      auVar43 = vsubps_avx512vl(auVar43,auVar38);
      auVar54._0_4_ = fVar96 * auVar43._0_4_;
      auVar54._4_4_ = fVar97 * auVar43._4_4_;
      auVar54._8_4_ = fVar98 * auVar43._8_4_;
      auVar54._12_4_ = fVar99 * auVar43._12_4_;
      auVar43 = vminps_avx(auVar44,auVar54);
      auVar42 = vminps_avx(auVar42,auVar43);
      uVar12 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar42,2);
      uVar24 = (uint)uVar12;
      if (((uint)uVar35 & 7) == 6) {
        uVar13 = vcmpps_avx512vl(auVar45,*(undefined1 (*) [16])(uVar22 + 0xf0),1);
        uVar14 = vcmpps_avx512vl(auVar45,*(undefined1 (*) [16])(uVar22 + 0xe0),0xd);
        uVar24 = (uint)(byte)((byte)uVar13 & (byte)uVar14 & (byte)uVar12);
      }
      if ((byte)uVar24 == 0) goto LAB_01cbf921;
      lVar29 = 0;
      for (uVar35 = (ulong)(byte)uVar24; (uVar35 & 1) == 0;
          uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar35 = *(ulong *)(uVar22 + lVar29 * 8);
      uVar24 = (uVar24 & 0xff) - 1 & uVar24 & 0xff;
      uVar26 = (ulong)uVar24;
      if (uVar24 != 0) {
        uVar27 = tNear.field_0.i[lVar29];
        lVar29 = 0;
        for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar24 = uVar24 - 1 & uVar24;
        uVar28 = (ulong)uVar24;
        uVar26 = *(ulong *)(uVar22 + lVar29 * 8);
        uVar25 = tNear.field_0.i[lVar29];
        if (uVar24 == 0) {
          if (uVar27 < uVar25) {
            (pSVar31->ptr).ptr = uVar26;
            pSVar31->dist = uVar25;
            pSVar31 = pSVar31 + 1;
          }
          else {
            (pSVar31->ptr).ptr = uVar35;
            pSVar31->dist = uVar27;
            uVar35 = uVar26;
            pSVar31 = pSVar31 + 1;
          }
        }
        else {
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar35;
          auVar42 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar27));
          auVar55._8_8_ = 0;
          auVar55._0_8_ = uVar26;
          auVar43 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar25));
          lVar29 = 0;
          for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar24 = uVar24 - 1 & uVar24;
          uVar35 = (ulong)uVar24;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(uVar22 + lVar29 * 8);
          auVar55 = vpunpcklqdq_avx(auVar56,ZEXT416((uint)tNear.field_0.i[lVar29]));
          auVar44 = vpshufd_avx(auVar42,0xaa);
          auVar45 = vpshufd_avx(auVar43,0xaa);
          auVar54 = vpshufd_avx(auVar55,0xaa);
          if (uVar24 == 0) {
            uVar35 = vpcmpgtd_avx512vl(auVar45,auVar44);
            uVar35 = uVar35 & 0xf;
            auVar45 = vpblendmd_avx512vl(auVar43,auVar42);
            bVar6 = (bool)((byte)uVar35 & 1);
            auVar60._0_4_ = (uint)bVar6 * auVar45._0_4_ | (uint)!bVar6 * auVar44._0_4_;
            bVar6 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar44._4_4_;
            bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar44._8_4_;
            bVar6 = SUB81(uVar35 >> 3,0);
            auVar60._12_4_ = (uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar44._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar43);
            bVar6 = (bool)((byte)uVar35 & 1);
            auVar61._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar42._0_4_;
            bVar6 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar42._4_4_;
            bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar42._8_4_;
            bVar6 = SUB81(uVar35 >> 3,0);
            auVar61._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar42._12_4_;
            auVar42 = vpshufd_avx(auVar60,0xaa);
            uVar22 = vpcmpgtd_avx512vl(auVar54,auVar42);
            uVar22 = uVar22 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar55,auVar60);
            bVar6 = (bool)((byte)uVar22 & 1);
            bVar7 = (bool)((byte)(uVar22 >> 1) & 1);
            uVar35 = CONCAT44((uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar42._4_4_,
                              (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar42._0_4_);
            auVar42 = vmovdqa32_avx512vl(auVar55);
            bVar6 = (bool)((byte)uVar22 & 1);
            auVar62._0_4_ = (uint)bVar6 * auVar42._0_4_ | !bVar6 * auVar60._0_4_;
            bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar6 * auVar42._4_4_ | !bVar6 * auVar60._4_4_;
            bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar6 * auVar42._8_4_ | !bVar6 * auVar60._8_4_;
            bVar6 = SUB81(uVar22 >> 3,0);
            auVar62._12_4_ = (uint)bVar6 * auVar42._12_4_ | !bVar6 * auVar60._12_4_;
            auVar42 = vpshufd_avx(auVar62,0xaa);
            auVar43 = vpshufd_avx(auVar61,0xaa);
            uVar22 = vpcmpgtd_avx512vl(auVar42,auVar43);
            uVar22 = uVar22 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar62,auVar61);
            bVar6 = (bool)((byte)uVar22 & 1);
            SVar46.ptr.ptr._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar42._0_4_;
            bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
            SVar46.ptr.ptr._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar42._4_4_;
            bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
            SVar46.dist = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar42._8_4_;
            bVar6 = SUB81(uVar22 >> 3,0);
            SVar46._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar42._12_4_;
            auVar42 = vmovdqa32_avx512vl(auVar62);
            bVar6 = (bool)((byte)uVar22 & 1);
            bVar7 = (bool)((byte)(uVar22 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar22 >> 2) & 1);
            bVar10 = SUB81(uVar22 >> 3,0);
            *(uint *)&(pSVar31->ptr).ptr = (uint)bVar6 * auVar42._0_4_ | !bVar6 * auVar61._0_4_;
            *(uint *)((long)&(pSVar31->ptr).ptr + 4) =
                 (uint)bVar7 * auVar42._4_4_ | !bVar7 * auVar61._4_4_;
            pSVar31->dist = (uint)bVar8 * auVar42._8_4_ | !bVar8 * auVar61._8_4_;
            *(uint *)&pSVar31->field_0xc = (uint)bVar10 * auVar42._12_4_ | !bVar10 * auVar61._12_4_;
            pSVar31[1] = SVar46;
            pSVar31 = pSVar31 + 2;
          }
          else {
            lVar29 = 0;
            for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            uVar24 = tNear.field_0.i[lVar29];
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)(uVar22 + lVar29 * 8);
            auVar56 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar24));
            uVar35 = vpcmpgtd_avx512vl(auVar45,auVar44);
            uVar35 = uVar35 & 0xf;
            auVar45 = vpblendmd_avx512vl(auVar43,auVar42);
            bVar6 = (bool)((byte)uVar35 & 1);
            auVar57._0_4_ = (uint)bVar6 * auVar45._0_4_ | (uint)!bVar6 * auVar44._0_4_;
            bVar6 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar44._4_4_;
            bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar44._8_4_;
            bVar6 = SUB81(uVar35 >> 3,0);
            auVar57._12_4_ = (uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar44._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar43);
            bVar6 = (bool)((byte)uVar35 & 1);
            auVar58._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar42._0_4_;
            bVar6 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar42._4_4_;
            bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar42._8_4_;
            bVar6 = SUB81(uVar35 >> 3,0);
            auVar58._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar42._12_4_;
            auVar53._4_4_ = uVar24;
            auVar53._0_4_ = uVar24;
            auVar53._8_4_ = uVar24;
            auVar53._12_4_ = uVar24;
            uVar35 = vpcmpgtd_avx512vl(auVar53,auVar54);
            uVar35 = uVar35 & 0xf;
            auVar42 = vpblendmd_avx512vl(auVar56,auVar55);
            bVar6 = (bool)((byte)uVar35 & 1);
            auVar49._0_4_ = (uint)bVar6 * auVar42._0_4_ | !bVar6 * uVar24;
            bVar6 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar6 * auVar42._4_4_ | !bVar6 * uVar24;
            bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar6 * auVar42._8_4_ | !bVar6 * uVar24;
            bVar6 = SUB81(uVar35 >> 3,0);
            auVar49._12_4_ = (uint)bVar6 * auVar42._12_4_ | !bVar6 * uVar24;
            auVar42 = vmovdqa32_avx512vl(auVar56);
            bVar6 = (bool)((byte)uVar35 & 1);
            auVar50._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar55._0_4_;
            bVar6 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar55._4_4_;
            bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar55._8_4_;
            bVar6 = SUB81(uVar35 >> 3,0);
            auVar50._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar55._12_4_;
            auVar42 = vpshufd_avx(auVar50,0xaa);
            auVar43 = vpshufd_avx(auVar58,0xaa);
            uVar35 = vpcmpgtd_avx512vl(auVar42,auVar43);
            uVar35 = uVar35 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar50,auVar58);
            bVar6 = (bool)((byte)uVar35 & 1);
            auVar51._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar42._0_4_;
            bVar6 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar42._4_4_;
            bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar42._8_4_;
            bVar6 = SUB81(uVar35 >> 3,0);
            auVar51._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar42._12_4_;
            auVar44 = vmovdqa32_avx512vl(auVar50);
            bVar6 = (bool)((byte)uVar35 & 1);
            bVar8 = (bool)((byte)(uVar35 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar35 >> 2) & 1);
            bVar11 = SUB81(uVar35 >> 3,0);
            auVar42 = vpshufd_avx(auVar49,0xaa);
            auVar43 = vpshufd_avx(auVar57,0xaa);
            uVar22 = vpcmpgtd_avx512vl(auVar42,auVar43);
            uVar22 = uVar22 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar49,auVar57);
            bVar7 = (bool)((byte)uVar22 & 1);
            bVar10 = (bool)((byte)(uVar22 >> 1) & 1);
            uVar35 = CONCAT44((uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar42._4_4_,
                              (uint)bVar7 * auVar43._0_4_ | (uint)!bVar7 * auVar42._0_4_);
            auVar42 = vmovdqa32_avx512vl(auVar49);
            bVar7 = (bool)((byte)uVar22 & 1);
            auVar52._0_4_ = (uint)bVar7 * auVar42._0_4_ | !bVar7 * auVar57._0_4_;
            bVar7 = (bool)((byte)(uVar22 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar7 * auVar42._4_4_ | !bVar7 * auVar57._4_4_;
            bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar7 * auVar42._8_4_ | !bVar7 * auVar57._8_4_;
            bVar7 = SUB81(uVar22 >> 3,0);
            auVar52._12_4_ = (uint)bVar7 * auVar42._12_4_ | !bVar7 * auVar57._12_4_;
            auVar42 = vpshufd_avx(auVar52,0xaa);
            auVar43 = vpshufd_avx(auVar51,0xaa);
            uVar22 = vpcmpgtd_avx512vl(auVar43,auVar42);
            uVar22 = uVar22 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar51,auVar52);
            bVar7 = (bool)((byte)uVar22 & 1);
            SVar47.ptr.ptr._0_4_ = (uint)bVar7 * auVar43._0_4_ | (uint)!bVar7 * auVar42._0_4_;
            bVar7 = (bool)((byte)(uVar22 >> 1) & 1);
            SVar47.ptr.ptr._4_4_ = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar42._4_4_;
            bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
            SVar47.dist = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * auVar42._8_4_;
            bVar7 = SUB81(uVar22 >> 3,0);
            SVar47._12_4_ = (uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * auVar42._12_4_;
            auVar42 = vmovdqa32_avx512vl(auVar51);
            bVar7 = (bool)((byte)uVar22 & 1);
            SVar48.ptr.ptr._0_4_ = (uint)bVar7 * auVar42._0_4_ | !bVar7 * auVar52._0_4_;
            bVar7 = (bool)((byte)(uVar22 >> 1) & 1);
            SVar48.ptr.ptr._4_4_ = (uint)bVar7 * auVar42._4_4_ | !bVar7 * auVar52._4_4_;
            bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
            SVar48.dist = (uint)bVar7 * auVar42._8_4_ | !bVar7 * auVar52._8_4_;
            bVar7 = SUB81(uVar22 >> 3,0);
            SVar48._12_4_ = (uint)bVar7 * auVar42._12_4_ | !bVar7 * auVar52._12_4_;
            *(uint *)&(pSVar31->ptr).ptr = (uint)bVar6 * auVar44._0_4_ | !bVar6 * auVar58._0_4_;
            *(uint *)((long)&(pSVar31->ptr).ptr + 4) =
                 (uint)bVar8 * auVar44._4_4_ | !bVar8 * auVar58._4_4_;
            pSVar31->dist = (uint)bVar9 * auVar44._8_4_ | !bVar9 * auVar58._8_4_;
            *(uint *)&pSVar31->field_0xc = (uint)bVar11 * auVar44._12_4_ | !bVar11 * auVar58._12_4_;
            pSVar31[1] = SVar48;
            pSVar31[2] = SVar47;
            pSVar31 = pSVar31 + 3;
          }
        }
      }
    }
    local_11b8 = (ulong)((uint)uVar35 & 0xf) - 8;
    uVar35 = uVar35 & 0xfffffffffffffff0;
    for (local_11b0 = 0; local_11b0 != local_11b8; local_11b0 = local_11b0 + 1) {
      lVar29 = local_11b0 * 0x140;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar63._4_4_ = uVar85;
      auVar63._0_4_ = uVar85;
      auVar63._8_4_ = uVar85;
      auVar63._12_4_ = uVar85;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x90 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + lVar29));
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0xa0 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + 0x10 + lVar29));
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0xb0 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + 0x20 + lVar29));
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0xc0 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + 0x30 + lVar29));
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0xd0 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + 0x40 + lVar29));
      auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0xe0 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + 0x50 + lVar29));
      auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0xf0 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + 0x60 + lVar29));
      auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x100 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + 0x70 + lVar29));
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x110 + lVar29),auVar63,
                                *(undefined1 (*) [16])(uVar35 + 0x80 + lVar29));
      uVar85 = *(undefined4 *)(ray + k * 4);
      auVar67._4_4_ = uVar85;
      auVar67._0_4_ = uVar85;
      auVar67._8_4_ = uVar85;
      auVar67._12_4_ = uVar85;
      auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar80._4_4_ = uVar85;
      auVar80._0_4_ = uVar85;
      auVar80._8_4_ = uVar85;
      auVar80._12_4_ = uVar85;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar82._4_4_ = uVar85;
      auVar82._0_4_ = uVar85;
      auVar82._8_4_ = uVar85;
      auVar82._12_4_ = uVar85;
      fVar84 = *(float *)(ray + k * 4 + 0x60);
      auVar91._4_4_ = fVar84;
      auVar91._0_4_ = fVar84;
      auVar91._8_4_ = fVar84;
      auVar91._12_4_ = fVar84;
      auVar42 = vsubps_avx(auVar42,auVar67);
      auVar51 = vsubps_avx512vl(auVar43,auVar49);
      auVar52 = vsubps_avx512vl(auVar44,auVar50);
      auVar53 = vsubps_avx512vl(auVar45,auVar67);
      auVar54 = vsubps_avx512vl(auVar54,auVar49);
      auVar55 = vsubps_avx512vl(auVar55,auVar50);
      auVar56 = vsubps_avx512vl(auVar56,auVar67);
      auVar57 = vsubps_avx512vl(auVar57,auVar49);
      auVar58 = vsubps_avx512vl(auVar58,auVar50);
      auVar49 = vsubps_avx512vl(auVar56,auVar42);
      auVar50 = vsubps_avx512vl(auVar57,auVar51);
      auVar43 = vsubps_avx(auVar58,auVar52);
      auVar59 = vsubps_avx512vl(auVar42,auVar53);
      auVar60 = vsubps_avx512vl(auVar51,auVar54);
      auVar61 = vsubps_avx512vl(auVar52,auVar55);
      auVar62 = vsubps_avx512vl(auVar53,auVar56);
      auVar63 = vsubps_avx512vl(auVar54,auVar57);
      auVar44 = vsubps_avx(auVar55,auVar58);
      auVar45 = vaddps_avx512vl(auVar56,auVar42);
      auVar64 = vaddps_avx512vl(auVar57,auVar51);
      auVar65 = vaddps_avx512vl(auVar58,auVar52);
      auVar66 = vmulps_avx512vl(auVar64,auVar43);
      auVar66 = vfmsub231ps_avx512vl(auVar66,auVar50,auVar65);
      auVar65 = vmulps_avx512vl(auVar65,auVar49);
      auVar65 = vfmsub231ps_avx512vl(auVar65,auVar43,auVar45);
      auVar77._0_4_ = auVar50._0_4_ * auVar45._0_4_;
      auVar77._4_4_ = auVar50._4_4_ * auVar45._4_4_;
      auVar77._8_4_ = auVar50._8_4_ * auVar45._8_4_;
      auVar77._12_4_ = auVar50._12_4_ * auVar45._12_4_;
      auVar45 = vfmsub231ps_fma(auVar77,auVar49,auVar64);
      auVar78._0_4_ = fVar84 * auVar45._0_4_;
      auVar78._4_4_ = fVar84 * auVar45._4_4_;
      auVar78._8_4_ = fVar84 * auVar45._8_4_;
      auVar78._12_4_ = fVar84 * auVar45._12_4_;
      auVar45 = vfmadd231ps_avx512vl(auVar78,auVar82,auVar65);
      tNear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar45,auVar80,auVar66);
      auVar45 = vaddps_avx512vl(auVar42,auVar53);
      auVar64 = vaddps_avx512vl(auVar51,auVar54);
      auVar65 = vaddps_avx512vl(auVar52,auVar55);
      auVar66 = vmulps_avx512vl(auVar64,auVar61);
      auVar66 = vfmsub231ps_avx512vl(auVar66,auVar60,auVar65);
      auVar65 = vmulps_avx512vl(auVar65,auVar59);
      auVar65 = vfmsub231ps_avx512vl(auVar65,auVar61,auVar45);
      auVar45 = vmulps_avx512vl(auVar45,auVar60);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar59,auVar64);
      auVar79._0_4_ = fVar84 * auVar45._0_4_;
      auVar79._4_4_ = fVar84 * auVar45._4_4_;
      auVar79._8_4_ = fVar84 * auVar45._8_4_;
      auVar79._12_4_ = fVar84 * auVar45._12_4_;
      auVar45 = vfmadd231ps_avx512vl(auVar79,auVar82,auVar65);
      auVar67 = vfmadd231ps_avx512vl(auVar45,auVar80,auVar66);
      auVar56 = vaddps_avx512vl(auVar53,auVar56);
      auVar54 = vaddps_avx512vl(auVar54,auVar57);
      auVar100._0_4_ = auVar55._0_4_ + auVar58._0_4_;
      auVar100._4_4_ = auVar55._4_4_ + auVar58._4_4_;
      auVar100._8_4_ = auVar55._8_4_ + auVar58._8_4_;
      auVar100._12_4_ = auVar55._12_4_ + auVar58._12_4_;
      auVar45 = vmulps_avx512vl(auVar54,auVar44);
      auVar45 = vfmsub231ps_fma(auVar45,auVar63,auVar100);
      auVar101._0_4_ = auVar100._0_4_ * auVar62._0_4_;
      auVar101._4_4_ = auVar100._4_4_ * auVar62._4_4_;
      auVar101._8_4_ = auVar100._8_4_ * auVar62._8_4_;
      auVar101._12_4_ = auVar100._12_4_ * auVar62._12_4_;
      auVar55 = vfmsub231ps_avx512vl(auVar101,auVar44,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar63);
      auVar54 = vfmsub231ps_avx512vl(auVar56,auVar62,auVar54);
      auVar54 = vmulps_avx512vl(auVar54,auVar91);
      auVar54 = vfmadd231ps_avx512vl(auVar54,auVar82,auVar55);
      auVar45 = vfmadd231ps_avx512vl(auVar54,auVar80,auVar45);
      auVar102._0_4_ = tNear.field_0._0_4_ + auVar67._0_4_;
      auVar102._4_4_ = tNear.field_0._4_4_ + auVar67._4_4_;
      auVar102._8_4_ = tNear.field_0._8_4_ + auVar67._8_4_;
      auVar102._12_4_ = tNear.field_0._12_4_ + auVar67._12_4_;
      auVar54 = vaddps_avx512vl(auVar45,auVar102);
      auVar64._8_4_ = 0x7fffffff;
      auVar64._0_8_ = 0x7fffffff7fffffff;
      auVar64._12_4_ = 0x7fffffff;
      auVar55 = vandps_avx512vl(auVar54,auVar64);
      auVar65._8_4_ = 0x34000000;
      auVar65._0_8_ = 0x3400000034000000;
      auVar65._12_4_ = 0x34000000;
      auVar56 = vmulps_avx512vl(auVar55,auVar65);
      auVar57 = vminps_avx512vl((undefined1  [16])tNear.field_0,auVar67);
      auVar57 = vminps_avx512vl(auVar57,auVar45);
      auVar66._8_4_ = 0x80000000;
      auVar66._0_8_ = 0x8000000080000000;
      auVar66._12_4_ = 0x80000000;
      auVar58 = vxorps_avx512vl(auVar56,auVar66);
      uVar12 = vcmpps_avx512vl(auVar57,auVar58,5);
      auVar57 = vmaxps_avx512vl((undefined1  [16])tNear.field_0,auVar67);
      auVar45 = vmaxps_avx512vl(auVar57,auVar45);
      uVar13 = vcmpps_avx512vl(auVar45,auVar56,2);
      bVar15 = ((byte)uVar12 | (byte)uVar13) & 0xf;
      if (bVar15 != 0) {
        auVar45 = vmulps_avx512vl(auVar60,auVar43);
        auVar56 = vmulps_avx512vl(auVar49,auVar61);
        auVar57 = vmulps_avx512vl(auVar59,auVar50);
        auVar58 = vmulps_avx512vl(auVar63,auVar61);
        auVar53 = vmulps_avx512vl(auVar59,auVar44);
        auVar64 = vmulps_avx512vl(auVar62,auVar60);
        auVar50 = vfmsub213ps_avx512vl(auVar50,auVar61,auVar45);
        auVar43 = vfmsub213ps_avx512vl(auVar43,auVar59,auVar56);
        auVar49 = vfmsub213ps_avx512vl(auVar49,auVar60,auVar57);
        auVar44 = vfmsub213ps_avx512vl(auVar44,auVar60,auVar58);
        auVar60 = vfmsub213ps_avx512vl(auVar62,auVar61,auVar53);
        auVar59 = vfmsub213ps_avx512vl(auVar63,auVar59,auVar64);
        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar45 = vandps_avx512vl(auVar45,auVar61);
        auVar58 = vandps_avx512vl(auVar58,auVar61);
        uVar22 = vcmpps_avx512vl(auVar45,auVar58,1);
        auVar45 = vandps_avx512vl(auVar56,auVar61);
        auVar56 = vandps_avx512vl(auVar53,auVar61);
        uVar26 = vcmpps_avx512vl(auVar45,auVar56,1);
        auVar45 = vandps_avx512vl(auVar57,auVar61);
        auVar56 = vandps_avx512vl(auVar64,auVar61);
        uVar28 = vcmpps_avx512vl(auVar45,auVar56,1);
        bVar6 = (bool)((byte)uVar22 & 1);
        local_1088._0_4_ = (uint)bVar6 * auVar50._0_4_ | (uint)!bVar6 * auVar44._0_4_;
        bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
        local_1088._4_4_ = (uint)bVar6 * auVar50._4_4_ | (uint)!bVar6 * auVar44._4_4_;
        bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
        local_1088._8_4_ = (uint)bVar6 * auVar50._8_4_ | (uint)!bVar6 * auVar44._8_4_;
        bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
        local_1088._12_4_ = (uint)bVar6 * auVar50._12_4_ | (uint)!bVar6 * auVar44._12_4_;
        bVar6 = (bool)((byte)uVar26 & 1);
        local_1078._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar60._0_4_;
        bVar6 = (bool)((byte)(uVar26 >> 1) & 1);
        local_1078._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar60._4_4_;
        bVar6 = (bool)((byte)(uVar26 >> 2) & 1);
        local_1078._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar60._8_4_;
        bVar6 = (bool)((byte)(uVar26 >> 3) & 1);
        local_1078._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar60._12_4_;
        bVar6 = (bool)((byte)uVar28 & 1);
        local_1068[0] = (float)((uint)bVar6 * auVar49._0_4_ | (uint)!bVar6 * auVar59._0_4_);
        bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
        local_1068[1] = (float)((uint)bVar6 * auVar49._4_4_ | (uint)!bVar6 * auVar59._4_4_);
        bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
        local_1068[2] = (float)((uint)bVar6 * auVar49._8_4_ | (uint)!bVar6 * auVar59._8_4_);
        bVar6 = (bool)((byte)(uVar28 >> 3) & 1);
        local_1068[3] = (float)((uint)bVar6 * auVar49._12_4_ | (uint)!bVar6 * auVar59._12_4_);
        auVar92._0_4_ = fVar84 * local_1068[0];
        auVar92._4_4_ = fVar84 * local_1068[1];
        auVar92._8_4_ = fVar84 * local_1068[2];
        auVar92._12_4_ = fVar84 * local_1068[3];
        auVar43 = vfmadd213ps_fma(auVar82,local_1078,auVar92);
        auVar43 = vfmadd213ps_fma(auVar80,local_1088,auVar43);
        auVar81._0_4_ = auVar43._0_4_ + auVar43._0_4_;
        auVar81._4_4_ = auVar43._4_4_ + auVar43._4_4_;
        auVar81._8_4_ = auVar43._8_4_ + auVar43._8_4_;
        auVar81._12_4_ = auVar43._12_4_ + auVar43._12_4_;
        auVar83._0_4_ = auVar52._0_4_ * local_1068[0];
        auVar83._4_4_ = auVar52._4_4_ * local_1068[1];
        auVar83._8_4_ = auVar52._8_4_ * local_1068[2];
        auVar83._12_4_ = auVar52._12_4_ * local_1068[3];
        auVar43 = vfmadd213ps_fma(auVar51,local_1078,auVar83);
        auVar43 = vfmadd213ps_fma(auVar42,local_1088,auVar43);
        auVar42 = vrcp14ps_avx512vl(auVar81);
        auVar16._8_4_ = 0x3f800000;
        auVar16._0_8_ = 0x3f8000003f800000;
        auVar16._12_4_ = 0x3f800000;
        auVar44 = vfnmadd213ps_avx512vl(auVar42,auVar81,auVar16);
        auVar42 = vfmadd132ps_fma(auVar44,auVar42,auVar42);
        uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar86._4_4_ = uVar85;
        auVar86._0_4_ = uVar85;
        auVar86._8_4_ = uVar85;
        auVar86._12_4_ = uVar85;
        auVar103 = ZEXT1664(auVar86);
        local_1098._0_4_ = auVar42._0_4_ * (auVar43._0_4_ + auVar43._0_4_);
        local_1098._4_4_ = auVar42._4_4_ * (auVar43._4_4_ + auVar43._4_4_);
        local_1098._8_4_ = auVar42._8_4_ * (auVar43._8_4_ + auVar43._8_4_);
        local_1098._12_4_ = auVar42._12_4_ * (auVar43._12_4_ + auVar43._12_4_);
        auVar75 = ZEXT1664(local_1098);
        uVar12 = vcmpps_avx512vl(local_1098,auVar86,2);
        uVar85 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar17._4_4_ = uVar85;
        auVar17._0_4_ = uVar85;
        auVar17._8_4_ = uVar85;
        auVar17._12_4_ = uVar85;
        uVar13 = vcmpps_avx512vl(local_1098,auVar17,0xd);
        bVar15 = (byte)uVar12 & (byte)uVar13 & bVar15;
        if (bVar15 != 0) {
          uVar12 = vcmpps_avx512vl(auVar81,_DAT_01f45a50,4);
          bVar15 = bVar15 & (byte)uVar12;
          if (bVar15 != 0) {
            pSVar3 = context->scene;
            auVar18._8_4_ = 0x219392ef;
            auVar18._0_8_ = 0x219392ef219392ef;
            auVar18._12_4_ = 0x219392ef;
            uVar22 = vcmpps_avx512vl(auVar55,auVar18,5);
            auVar43 = vrcp14ps_avx512vl(auVar54);
            auVar76._8_4_ = 0x3f800000;
            auVar76._0_8_ = 0x3f8000003f800000;
            auVar76._12_4_ = 0x3f800000;
            auVar42 = vfnmadd213ps_fma(auVar54,auVar43,auVar76);
            auVar42 = vfmadd132ps_avx512vl(auVar42,auVar43,auVar43);
            fVar87 = (float)((uint)((byte)uVar22 & 1) * auVar42._0_4_);
            fVar96 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar42._4_4_);
            fVar90 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar42._8_4_);
            fVar84 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar42._12_4_);
            auVar70._0_4_ = fVar87 * tNear.field_0._0_4_;
            auVar70._4_4_ = fVar96 * tNear.field_0._4_4_;
            auVar70._8_4_ = fVar90 * tNear.field_0._8_4_;
            auVar70._12_4_ = fVar84 * tNear.field_0._12_4_;
            local_10b8 = vminps_avx(auVar70,auVar76);
            auVar71._0_4_ = fVar87 * auVar67._0_4_;
            auVar71._4_4_ = fVar96 * auVar67._4_4_;
            auVar71._8_4_ = fVar90 * auVar67._8_4_;
            auVar71._12_4_ = fVar84 * auVar67._12_4_;
            local_10a8 = vminps_avx(auVar71,auVar76);
            lVar29 = lVar29 + uVar35;
            auVar72._8_4_ = 0x7f800000;
            auVar72._0_8_ = 0x7f8000007f800000;
            auVar72._12_4_ = 0x7f800000;
            auVar42 = vblendmps_avx512vl(auVar72,local_1098);
            auVar68._0_4_ =
                 (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar15 >> 1 & 1);
            auVar68._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar15 >> 2 & 1);
            auVar68._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * 0x7f800000;
            auVar68._12_4_ =
                 (uint)(bVar15 >> 3) * auVar42._12_4_ | (uint)!(bool)(bVar15 >> 3) * 0x7f800000;
            auVar42 = vshufps_avx(auVar68,auVar68,0xb1);
            auVar42 = vminps_avx(auVar42,auVar68);
            auVar43 = vshufpd_avx(auVar42,auVar42,1);
            auVar42 = vminps_avx(auVar43,auVar42);
            uVar12 = vcmpps_avx512vl(auVar68,auVar42,0);
            bVar34 = bVar15;
            if (((byte)uVar12 & bVar15) != 0) {
              bVar34 = (byte)uVar12 & bVar15;
            }
            uVar24 = 0;
            for (uVar27 = (uint)bVar34; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
              uVar24 = uVar24 + 1;
            }
            do {
              uVar25 = uVar24 & 0xff;
              uVar27 = *(uint *)(lVar29 + 0x120 + (ulong)uVar25 * 4);
              pGVar4 = (pSVar3->geometries).items[uVar27].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar15 = ~(byte)(1 << (uVar24 & 0x1f)) & bVar15;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar22 = (ulong)(uVar25 << 2);
                  uVar85 = *(undefined4 *)(local_10b8 + uVar22);
                  uVar2 = *(undefined4 *)(local_10a8 + uVar22);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1098 + uVar22);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1088 + uVar22);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1078 + uVar22);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_1068 + uVar22);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar85;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar29 + 0x130 + uVar22);
                  *(uint *)(ray + k * 4 + 0x120) = uVar27;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar22 = (ulong)(uVar25 * 4);
                uVar85 = *(undefined4 *)(local_10b8 + uVar22);
                local_fd8._4_4_ = uVar85;
                local_fd8._0_4_ = uVar85;
                local_fd8._8_4_ = uVar85;
                local_fd8._12_4_ = uVar85;
                local_fc8 = *(undefined4 *)(local_10a8 + uVar22);
                local_fa8 = vpbroadcastd_avx512vl();
                uVar85 = *(undefined4 *)(lVar29 + 0x130 + uVar22);
                local_fb8._4_4_ = uVar85;
                local_fb8._0_4_ = uVar85;
                local_fb8._8_4_ = uVar85;
                local_fb8._12_4_ = uVar85;
                uVar85 = *(undefined4 *)(local_1088 + uVar22);
                uVar2 = *(undefined4 *)(local_1078 + uVar22);
                local_ff8._4_4_ = uVar2;
                local_ff8._0_4_ = uVar2;
                local_ff8._8_4_ = uVar2;
                local_ff8._12_4_ = uVar2;
                uVar2 = *(undefined4 *)((long)local_1068 + uVar22);
                local_fe8._4_4_ = uVar2;
                local_fe8._0_4_ = uVar2;
                local_fe8._8_4_ = uVar2;
                local_fe8._12_4_ = uVar2;
                local_1008[0] = (RTCHitN)(char)uVar85;
                local_1008[1] = (RTCHitN)(char)((uint)uVar85 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar85;
                local_1008[5] = (RTCHitN)(char)((uint)uVar85 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar85;
                local_1008[9] = (RTCHitN)(char)((uint)uVar85 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar85;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar85 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
                uStack_fc4 = local_fc8;
                uStack_fc0 = local_fc8;
                uStack_fbc = local_fc8;
                vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                uStack_f94 = context->user->instID[0];
                local_f98 = uStack_f94;
                uStack_f90 = uStack_f94;
                uStack_f8c = uStack_f94;
                uStack_f88 = context->user->instPrimID[0];
                uStack_f84 = uStack_f88;
                uStack_f80 = uStack_f88;
                uStack_f7c = uStack_f88;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1098 + uVar22);
                local_11c8 = local_1058;
                args.valid = (int *)local_11c8;
                args.geometryUserPtr = pGVar4->userPtr;
                args.context = context->user;
                args.hit = local_1008;
                args.N = 4;
                auVar42 = auVar75._0_16_;
                auVar43 = auVar103._0_16_;
                args.ray = (RTCRayN *)ray;
                if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->intersectionFilterN)(&args);
                  auVar103 = ZEXT1664(auVar43);
                  auVar75 = ZEXT1664(auVar42);
                }
                uVar22 = vptestmd_avx512vl(local_11c8,local_11c8);
                if ((uVar22 & 0xf) == 0) {
LAB_01cc04f2:
                  *(int *)(ray + k * 4 + 0x80) = auVar103._0_4_;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&args);
                    auVar103 = ZEXT1664(auVar43);
                    auVar75 = ZEXT1664(auVar42);
                  }
                  uVar22 = vptestmd_avx512vl(local_11c8,local_11c8);
                  uVar22 = uVar22 & 0xf;
                  bVar34 = (byte)uVar22;
                  if (bVar34 == 0) goto LAB_01cc04f2;
                  iVar1 = *(int *)(args.hit + 4);
                  iVar19 = *(int *)(args.hit + 8);
                  iVar20 = *(int *)(args.hit + 0xc);
                  bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                  bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
                  bVar8 = SUB81(uVar22 >> 3,0);
                  *(uint *)(args.ray + 0xc0) =
                       (uint)(bVar34 & 1) * *(int *)args.hit |
                       (uint)!(bool)(bVar34 & 1) * *(uint *)(args.ray + 0xc0);
                  *(uint *)(args.ray + 0xc4) =
                       (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0xc4);
                  *(uint *)(args.ray + 200) =
                       (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 200);
                  *(uint *)(args.ray + 0xcc) =
                       (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0xcc);
                  iVar1 = *(int *)(args.hit + 0x14);
                  iVar19 = *(int *)(args.hit + 0x18);
                  iVar20 = *(int *)(args.hit + 0x1c);
                  bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                  bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
                  bVar8 = SUB81(uVar22 >> 3,0);
                  *(uint *)(args.ray + 0xd0) =
                       (uint)(bVar34 & 1) * *(int *)(args.hit + 0x10) |
                       (uint)!(bool)(bVar34 & 1) * *(uint *)(args.ray + 0xd0);
                  *(uint *)(args.ray + 0xd4) =
                       (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0xd4);
                  *(uint *)(args.ray + 0xd8) =
                       (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 0xd8);
                  *(uint *)(args.ray + 0xdc) =
                       (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0xdc);
                  iVar1 = *(int *)(args.hit + 0x24);
                  iVar19 = *(int *)(args.hit + 0x28);
                  iVar20 = *(int *)(args.hit + 0x2c);
                  bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                  bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
                  bVar8 = SUB81(uVar22 >> 3,0);
                  *(uint *)(args.ray + 0xe0) =
                       (uint)(bVar34 & 1) * *(int *)(args.hit + 0x20) |
                       (uint)!(bool)(bVar34 & 1) * *(uint *)(args.ray + 0xe0);
                  *(uint *)(args.ray + 0xe4) =
                       (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0xe4);
                  *(uint *)(args.ray + 0xe8) =
                       (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 0xe8);
                  *(uint *)(args.ray + 0xec) =
                       (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0xec);
                  iVar1 = *(int *)(args.hit + 0x34);
                  iVar19 = *(int *)(args.hit + 0x38);
                  iVar20 = *(int *)(args.hit + 0x3c);
                  bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                  bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
                  bVar8 = SUB81(uVar22 >> 3,0);
                  *(uint *)(args.ray + 0xf0) =
                       (uint)(bVar34 & 1) * *(int *)(args.hit + 0x30) |
                       (uint)!(bool)(bVar34 & 1) * *(uint *)(args.ray + 0xf0);
                  *(uint *)(args.ray + 0xf4) =
                       (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0xf4);
                  *(uint *)(args.ray + 0xf8) =
                       (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 0xf8);
                  *(uint *)(args.ray + 0xfc) =
                       (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0xfc);
                  iVar1 = *(int *)(args.hit + 0x44);
                  iVar19 = *(int *)(args.hit + 0x48);
                  iVar20 = *(int *)(args.hit + 0x4c);
                  bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                  bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
                  bVar8 = SUB81(uVar22 >> 3,0);
                  *(uint *)(args.ray + 0x100) =
                       (uint)(bVar34 & 1) * *(int *)(args.hit + 0x40) |
                       (uint)!(bool)(bVar34 & 1) * *(uint *)(args.ray + 0x100);
                  *(uint *)(args.ray + 0x104) =
                       (uint)bVar6 * iVar1 | (uint)!bVar6 * *(int *)(args.ray + 0x104);
                  *(uint *)(args.ray + 0x108) =
                       (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 0x108);
                  *(uint *)(args.ray + 0x10c) =
                       (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0x10c);
                  auVar42 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar42;
                  auVar42 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar42;
                  auVar42 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar42;
                  auVar42 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar42;
                  auVar103 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                uVar85 = auVar103._0_4_;
                auVar74._4_4_ = uVar85;
                auVar74._0_4_ = uVar85;
                auVar74._8_4_ = uVar85;
                auVar74._12_4_ = uVar85;
                uVar12 = vcmpps_avx512vl(auVar75._0_16_,auVar74,2);
                bVar15 = ~(byte)(1 << (uVar24 & 0x1f)) & bVar15 & (byte)uVar12;
              }
              if (bVar15 == 0) break;
              auVar73._8_4_ = 0x7f800000;
              auVar73._0_8_ = 0x7f8000007f800000;
              auVar73._12_4_ = 0x7f800000;
              auVar42 = vblendmps_avx512vl(auVar73,auVar75._0_16_);
              auVar69._0_4_ =
                   (uint)(bVar15 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar15 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar15 >> 1 & 1);
              auVar69._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar15 >> 2 & 1);
              auVar69._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * 0x7f800000;
              auVar69._12_4_ =
                   (uint)(bVar15 >> 3) * auVar42._12_4_ | (uint)!(bool)(bVar15 >> 3) * 0x7f800000;
              auVar42 = vshufps_avx(auVar69,auVar69,0xb1);
              auVar42 = vminps_avx(auVar42,auVar69);
              auVar43 = vshufpd_avx(auVar42,auVar42,1);
              auVar42 = vminps_avx(auVar43,auVar42);
              uVar12 = vcmpps_avx512vl(auVar69,auVar42,0);
              bVar23 = (byte)uVar12 & bVar15;
              bVar34 = bVar15;
              if (bVar23 != 0) {
                bVar34 = bVar23;
              }
              uVar24 = 0;
              for (uVar27 = (uint)bVar34; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                uVar24 = uVar24 + 1;
              }
            } while( true );
          }
        }
      }
      auVar103 = ZEXT1664(local_1048);
      fVar84 = local_1018;
      fVar87 = fStack_1014;
      fVar88 = fStack_1010;
      fVar89 = fStack_100c;
      fVar90 = local_1028;
      fVar93 = fStack_1024;
      fVar94 = fStack_1020;
      fVar95 = fStack_101c;
      fVar96 = local_1038;
      fVar97 = fStack_1034;
      fVar98 = fStack_1030;
      fVar99 = fStack_102c;
    }
    uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar75 = ZEXT1664(CONCAT412(uVar85,CONCAT48(uVar85,CONCAT44(uVar85,uVar85))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }